

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::SetViewportId(ON_Viewport *this,ON_UUID *id)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  ON_UUID *a;
  bool bVar4;
  undefined1 auVar5 [16];
  
  auVar5[0] = -((char)id->Data1 == (char)(this->m_viewport_id).Data1);
  auVar5[1] = -(*(char *)((long)&id->Data1 + 1) == *(char *)((long)&(this->m_viewport_id).Data1 + 1)
               );
  auVar5[2] = -(*(char *)((long)&id->Data1 + 2) == *(char *)((long)&(this->m_viewport_id).Data1 + 2)
               );
  auVar5[3] = -(*(char *)((long)&id->Data1 + 3) == *(char *)((long)&(this->m_viewport_id).Data1 + 3)
               );
  auVar5[4] = -((char)id->Data2 == (char)(this->m_viewport_id).Data2);
  auVar5[5] = -(*(char *)((long)&id->Data2 + 1) == *(char *)((long)&(this->m_viewport_id).Data2 + 1)
               );
  auVar5[6] = -((char)id->Data3 == (char)(this->m_viewport_id).Data3);
  auVar5[7] = -(*(char *)((long)&id->Data3 + 1) == *(char *)((long)&(this->m_viewport_id).Data3 + 1)
               );
  auVar5[8] = -(id->Data4[0] == (this->m_viewport_id).Data4[0]);
  auVar5[9] = -(id->Data4[1] == (this->m_viewport_id).Data4[1]);
  auVar5[10] = -(id->Data4[2] == (this->m_viewport_id).Data4[2]);
  auVar5[0xb] = -(id->Data4[3] == (this->m_viewport_id).Data4[3]);
  auVar5[0xc] = -(id->Data4[4] == (this->m_viewport_id).Data4[4]);
  auVar5[0xd] = -(id->Data4[5] == (this->m_viewport_id).Data4[5]);
  auVar5[0xe] = -(id->Data4[6] == (this->m_viewport_id).Data4[6]);
  auVar5[0xf] = -(id->Data4[7] == (this->m_viewport_id).Data4[7]);
  bVar4 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf
                  ) == 0xffff;
  if (!bVar4) {
    a = &this->m_viewport_id;
    bVar4 = ::operator==(a,&ON_nil_uuid);
    if (bVar4) {
      uVar2 = id->Data2;
      uVar3 = id->Data3;
      uVar1 = *(undefined8 *)id->Data4;
      a->Data1 = id->Data1;
      a->Data2 = uVar2;
      a->Data3 = uVar3;
      *(undefined8 *)(this->m_viewport_id).Data4 = uVar1;
    }
  }
  return bVar4;
}

Assistant:

bool ON_Viewport::SetViewportId( const ON_UUID& id)
{
  // Please discuss any code changes with Dale Lear.
  // You should NEVER change the viewport id once
  // it is set.
  bool rc = (0 == memcmp(&m_viewport_id,&id,sizeof(m_viewport_id)));
  if ( !rc && m_viewport_id == ON_nil_uuid )
  {  
    m_viewport_id = id;
    rc = true;
  }
  return rc;
}